

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::UniformCase::renderTest
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,ShaderProgram *program,Random *rnd)

{
  CallLogWrapper *pCVar1;
  pointer *pppTVar2;
  pointer *pppTVar3;
  iterator __position;
  iterator __position_00;
  PixelBufferAccess *pPVar4;
  iterator iVar5;
  RenderContext *context;
  UniformCase *pUVar6;
  uint x;
  deUint32 dVar7;
  GLenum GVar8;
  RenderTarget *pRVar9;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var10;
  TextureFormat TVar11;
  long lVar12;
  Surface *surface;
  pointer pBVar13;
  VarValue *value;
  VarValue *value_00;
  void *__buf;
  int face;
  int iVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  Texture2D *texture;
  Surface renderedImg;
  Vec4 color;
  string local_290;
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  *local_270;
  uint local_264;
  undefined1 local_260 [8];
  void *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  int local_238;
  TestLog *local_230;
  VarValue *local_228;
  UniformCase *local_220;
  int local_214;
  int local_210;
  uint local_20c;
  Surface local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1f0;
  ShaderProgram *local_1e8;
  vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *local_1e0;
  vector<glu::TextureCube*,std::allocator<glu::TextureCube*>> *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [8];
  undefined1 auStack_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  ChannelOrder local_178;
  float *local_170;
  ios_base local_140 [272];
  
  local_230 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_270 = basicUniforms;
  local_1e8 = program;
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar14 = pRVar9->m_width;
  local_214 = 0x20;
  if (iVar14 < 0x20) {
    local_214 = iVar14;
  }
  iVar18 = 0x20;
  if (pRVar9->m_height < 0x20) {
    iVar18 = pRVar9->m_height;
  }
  dVar7 = deRandom_getUint32(&rnd->m_rnd);
  local_20c = dVar7 % ((iVar14 - local_214) + 1U);
  iVar14 = pRVar9->m_height;
  dVar7 = deRandom_getUint32(&rnd->m_rnd);
  local_264 = dVar7 % ((iVar14 - iVar18) + 1U);
  local_210 = iVar18;
  tcu::Surface::Surface(&local_208,local_214,iVar18);
  pBVar13 = (local_270->
            super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_220 = this;
  if (0 < (int)((ulong)((long)(local_270->
                              super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar13) >> 3) *
          0x286bca1b) {
    local_1f0 = &this->m_filledTextureUnits;
    pCVar1 = &this->super_CallLogWrapper;
    local_1d8 = (vector<glu::TextureCube*,std::allocator<glu::TextureCube*>> *)&this->m_texturesCube
    ;
    local_1e0 = (vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)&this->m_textures2d;
    lVar12 = 0;
    do {
      local_1c0 = lVar12;
      if ((pBVar13[lVar12].type - TYPE_SAMPLER_1D < 0x1e) &&
         (_Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             ((this->m_filledTextureUnits).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->m_filledTextureUnits).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish,
                              &pBVar13[lVar12].finalValue.val),
         _Var10._M_current ==
         (this->m_filledTextureUnits).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        local_1b8 = (undefined1  [8])local_230;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_1b0,"// Filling texture at unit ",0x1b);
        apiVarValueStr_abi_cxx11_
                  ((string *)local_260,
                   (Functional *)
                   &(local_270->
                    super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar12].finalValue,value);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_1b0,(char *)local_260,(long)local_258);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_1b0," with color ",0xc);
        shaderVarValueStr_abi_cxx11_
                  (&local_290,
                   (Functional *)
                   &(local_270->
                    super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar12].finalValue,value_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_1b0,local_290._M_dataplus._M_p,local_290._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if (local_260 != (undefined1  [8])&local_250) {
          operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
        std::ios_base::~ios_base(local_140);
        pBVar13 = (local_270->
                  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_228 = &pBVar13[lVar12].finalValue;
        (this->super_CallLogWrapper).m_enableLog = false;
        local_1b8 = *(undefined1 (*) [8])((long)&pBVar13[lVar12].finalValue.val + 4);
        auStack_1b0 = *(undefined1 (*) [8])((long)&pBVar13[lVar12].finalValue.val + 0xc);
        if (local_228->type == TYPE_SAMPLER_CUBE) {
          TVar11 = (TextureFormat)operator_new(0x180);
          glu::TextureCube::TextureCube
                    ((TextureCube *)TVar11,((this->super_TestCase).m_context)->m_renderCtx,0x1908,
                     0x1401,0x20);
          __position_00._M_current =
               (this->m_texturesCube).
               super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_260 = (undefined1  [8])TVar11;
          if (__position_00._M_current ==
              (this->m_texturesCube).
              super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<glu::TextureCube*,std::allocator<glu::TextureCube*>>::
            _M_realloc_insert<glu::TextureCube*const&>
                      (local_1d8,__position_00,(TextureCube **)local_260);
          }
          else {
            *__position_00._M_current = (TextureCube *)TVar11;
            pppTVar3 = &(this->m_texturesCube).
                        super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppTVar3 = *pppTVar3 + 1;
          }
          local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)TVar11 + 0x10);
          local_1d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)TVar11 + 0xb0);
          lVar12 = 0;
          do {
            paVar15 = local_1d0;
            tcu::TextureCube::allocLevel((TextureCube *)local_1c8,(CubeFace)lVar12,0);
            pPVar4 = (((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                      ((long)paVar15 + lVar12 * 0x18))->
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[2]) {
              iVar14 = 0;
              do {
                if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[1]) {
                  iVar18 = 0;
                  do {
                    if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[0]) {
                      iVar19 = 0;
                      do {
                        tcu::PixelBufferAccess::setPixel
                                  (pPVar4,(Vec4 *)local_1b8,iVar19,iVar18,iVar14);
                        iVar19 = iVar19 + 1;
                      } while (iVar19 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[0]);
                    }
                    iVar18 = iVar18 + 1;
                  } while (iVar18 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[1]);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[2]);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 6);
          glu::CallLogWrapper::glActiveTexture(pCVar1,(local_228->val).intV[0] + 0x84c0);
          this = local_220;
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,"glActiveTexture(GL_TEXTURE0 + value.val.samplerV.unit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,0x4ea);
          local_290._M_dataplus._M_p._0_4_ = (local_228->val).intV[0];
          iVar5._M_current =
               (this->m_filledTextureUnits).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->m_filledTextureUnits).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_1f0,iVar5,(uint *)&local_290);
          }
          else {
            *iVar5._M_current = (local_228->val).intV[0];
            (this->m_filledTextureUnits).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          glu::TextureCube::upload((TextureCube *)local_260);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2802,0x812f);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,0x4ed);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2803,0x812f);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,0x4ee);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2801,0x2600);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,0x4ef);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2800,0x2600);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,0x4f0);
        }
        else if (local_228->type == TYPE_SAMPLER_2D) {
          TVar11 = (TextureFormat)operator_new(0x70);
          glu::Texture2D::Texture2D
                    ((Texture2D *)TVar11,((this->super_TestCase).m_context)->m_renderCtx,0x1908,
                     0x1401,0x20,0x20);
          __position._M_current =
               (this->m_textures2d).
               super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_260 = (undefined1  [8])TVar11;
          if (__position._M_current ==
              (this->m_textures2d).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::
            _M_realloc_insert<glu::Texture2D*const&>(local_1e0,__position,(Texture2D **)local_260);
          }
          else {
            *__position._M_current = (Texture2D *)TVar11;
            pppTVar2 = &(this->m_textures2d).
                        super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppTVar2 = *pppTVar2 + 1;
          }
          tcu::Texture2D::allocLevel((Texture2D *)((long)TVar11 + 0x18),0);
          pPVar4 = (((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                    ((long)TVar11 + 0x38))->
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[2]) {
            iVar14 = 0;
            do {
              if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[1]) {
                iVar18 = 0;
                do {
                  if (0 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[0]) {
                    iVar19 = 0;
                    do {
                      tcu::PixelBufferAccess::setPixel
                                (pPVar4,(Vec4 *)local_1b8,iVar19,iVar18,iVar14);
                      iVar19 = iVar19 + 1;
                    } while (iVar19 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[0]);
                  }
                  iVar18 = iVar18 + 1;
                } while (iVar18 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[1]);
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 < (pPVar4->super_ConstPixelBufferAccess).m_size.m_data[2]);
          }
          glu::CallLogWrapper::glActiveTexture(pCVar1,(local_228->val).intV[0] + 0x84c0);
          this = local_220;
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,"glActiveTexture(GL_TEXTURE0 + value.val.samplerV.unit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,0x4d5);
          local_290._M_dataplus._M_p._0_4_ = (local_228->val).intV[0];
          iVar5._M_current =
               (this->m_filledTextureUnits).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->m_filledTextureUnits).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(local_1f0,iVar5,(uint *)&local_290);
          }
          else {
            *iVar5._M_current = (local_228->val).intV[0];
            (this->m_filledTextureUnits).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          (**(code **)(*(size_type *)local_260 + 0x10))();
          glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2802,0x812f);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,0x4d8);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2803,0x812f);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,
                          "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,0x4d9);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,"glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,0x4da);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
          GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
          glu::checkError(GVar8,"glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                          ,0x4db);
        }
        (this->super_CallLogWrapper).m_enableLog = true;
      }
      lVar12 = local_1c0 + 1;
      pBVar13 = (local_270->
                super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (lVar12 < (int)((ulong)((long)(local_270->
                                          super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pBVar13) >> 3) * 0x286bca1b);
  }
  x = local_20c;
  paVar15 = &local_290.field_2;
  pCVar1 = &this->super_CallLogWrapper;
  glu::CallLogWrapper::glViewport(pCVar1,local_20c,local_264,local_214,local_210);
  GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
  glu::checkError(GVar8,"glViewport(viewportX, viewportY, viewportW, viewportH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                  ,0x64a);
  glu::CallLogWrapper::glClearColor(pCVar1,0.0,0.0,0.0,1.0);
  GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
  glu::checkError(GVar8,"glClearColor(0.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                  ,0x64b);
  glu::CallLogWrapper::glClear(pCVar1,0x4000);
  GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
  glu::checkError(GVar8,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                  ,0x64c);
  glu::CallLogWrapper::glUseProgram(pCVar1,(local_1e8->m_program).m_program);
  GVar8 = glu::CallLogWrapper::glGetError(pCVar1);
  glu::checkError(GVar8,"glUseProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                  ,0x64d);
  local_290._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"a_position","");
  local_260._0_4_ = A;
  local_258 = (void *)((long)&local_250 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_290._M_dataplus._M_p,
             local_290._M_dataplus._M_p + local_290._M_string_length);
  local_238 = 0;
  local_1b8._0_4_ = local_260._0_4_;
  auStack_1b0 = (undefined1  [8])(local_1a8 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_1b0,local_258,local_250._M_allocated_capacity + (long)local_258);
  local_190 = local_238;
  local_188._M_allocated_capacity = 8;
  local_188._8_4_ = 4;
  local_188._12_4_ = 4;
  local_178 = R;
  local_170 = renderTest::position;
  if (local_258 != (void *)((long)&local_250 + 8)) {
    operator_delete(local_258,local_250._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar15) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  pUVar6 = local_220;
  local_260._0_4_ = R;
  local_260._4_4_ = UNORM_INT32;
  local_258 = (void *)CONCAT44(local_258._4_4_,1);
  local_250._M_allocated_capacity = (size_type)renderTest::indices;
  glu::draw(((local_220->super_TestCase).m_context)->m_renderCtx,(local_1e8->m_program).m_program,1,
            (VertexArrayBinding *)local_1b8,(PrimitiveList *)local_260,(DrawUtilCallback *)0x0);
  context = ((pUVar6->super_TestCase).m_context)->m_renderCtx;
  local_290._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_208.m_pixels.m_cap != (void *)0x0) {
    local_208.m_pixels.m_cap = (size_t)local_208.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_260,(TextureFormat *)&local_290,local_208.m_width,
             local_208.m_height,1,(void *)local_208.m_pixels.m_cap);
  glu::readPixels(context,x,local_264,(PixelBufferAccess *)local_260);
  if (auStack_1b0 != (undefined1  [8])(local_1a8 + 8)) {
    operator_delete((void *)auStack_1b0,local_1a0._M_allocated_capacity + 1);
  }
  if (local_208.m_height < 1) {
    iVar14 = 0;
  }
  else {
    iVar18 = 0;
    iVar19 = 0;
    iVar14 = 0;
    do {
      uVar16 = (ulong)(uint)local_208.m_width;
      iVar17 = iVar18;
      if (0 < local_208.m_width) {
        do {
          iVar14 = iVar14 + (uint)(*(int *)((long)local_208.m_pixels.m_ptr + (long)iVar17 * 4) !=
                                  -0xff0100);
          iVar17 = iVar17 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      iVar19 = iVar19 + 1;
      iVar18 = iVar18 + local_208.m_width;
    } while (iVar19 != local_208.m_height);
  }
  if (iVar14 < 1) {
    local_1b8 = (undefined1  [8])local_230;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_1b0,
               "Success: got all-green pixels (all uniforms have correct values)",0x40);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_260 = (undefined1  [8])&local_250;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"RenderedImage","");
    local_290._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Rendered image","");
    surface = &local_208;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,(string *)local_260,&local_290,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,(int)local_230,__buf,(size_t)surface);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._8_8_ != &local_188) {
      operator_delete((void *)local_1a0._8_8_,local_188._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])local_1a8) {
      operator_delete((void *)local_1b8,(long)local_1a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar15) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if (local_260 != (undefined1  [8])&local_250) {
      operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
    }
    local_1b8 = (undefined1  [8])local_230;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_1b0,"FAILURE: image comparison failed, got ",0x26);
    std::ostream::operator<<((ostringstream *)auStack_1b0,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_1b0," non-green pixels",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
  std::ios_base::~ios_base(local_140);
  tcu::Surface::~Surface(&local_208);
  return iVar14 < 1;
}

Assistant:

bool UniformCase::renderTest (const vector<BasicUniform>& basicUniforms, const ShaderProgram& program, Random& rnd)
{
	TestLog&					log				= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	const int					viewportW		= de::min<int>(renderTarget.getWidth(),		MAX_RENDER_WIDTH);
	const int					viewportH		= de::min<int>(renderTarget.getHeight(),	MAX_RENDER_HEIGHT);
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()		- viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()	- viewportH);
	tcu::Surface				renderedImg		(viewportW, viewportH);

	// Assert that no two samplers of different types have the same texture unit - this is an error in GL.
	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		if (glu::isDataTypeSampler(basicUniforms[i].type))
		{
			for (int j = 0; j < i; j++)
			{
				if (glu::isDataTypeSampler(basicUniforms[j].type) && basicUniforms[i].type != basicUniforms[j].type)
					DE_ASSERT(basicUniforms[i].finalValue.val.samplerV.unit != basicUniforms[j].finalValue.val.samplerV.unit);
			}
		}
	}

	for (int i = 0; i < (int)basicUniforms.size(); i++)
	{
		if (glu::isDataTypeSampler(basicUniforms[i].type) && std::find(m_filledTextureUnits.begin(), m_filledTextureUnits.end(), basicUniforms[i].finalValue.val.samplerV.unit) == m_filledTextureUnits.end())
		{
			log << TestLog::Message << "// Filling texture at unit " << apiVarValueStr(basicUniforms[i].finalValue) << " with color " << shaderVarValueStr(basicUniforms[i].finalValue) << TestLog::EndMessage;
			setupTexture(basicUniforms[i].finalValue);
		}
	}

	GLU_CHECK_CALL(glViewport(viewportX, viewportY, viewportW, viewportH));
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	{
		static const float position[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f, +1.0f, 0.0f, 1.0f,
			+1.0f, -1.0f, 0.0f, 1.0f,
			+1.0f, +1.0f, 0.0f, 1.0f
		};
		static const deUint16			indices[]	= { 0, 1, 2, 2, 1, 3 };
		const glu::VertexArrayBinding	binding		= glu::va::Float("a_position", 4, 4, 0, &position[0]);

		glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &binding, glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());
	}

	int numFailedPixels = 0;
	for (int y = 0; y < renderedImg.getHeight(); y++)
	{
		for (int x = 0; x < renderedImg.getWidth(); x++)
		{
			if (renderedImg.getPixel(x, y) != tcu::RGBA::green())
				numFailedPixels += 1;
		}
	}

	if (numFailedPixels > 0)
	{
		log << TestLog::Image("RenderedImage", "Rendered image", renderedImg);
		log << TestLog::Message << "FAILURE: image comparison failed, got " << numFailedPixels << " non-green pixels" << TestLog::EndMessage;
		return false;
	}
	else
	{
		log << TestLog::Message << "Success: got all-green pixels (all uniforms have correct values)" << TestLog::EndMessage;
		return true;
	}
}